

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v5::internal::
          parse_width<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  wchar_t wVar1;
  uint uVar2;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *in_RAX;
  assertion_failure *this;
  error_handler *peVar3;
  error_handler *this_00;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  local_18;
  
  if (begin == end) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  wVar1 = *begin;
  if ((uint)(wVar1 + L'\xffffffd0') < 10) {
    if (wVar1 == L'0') {
      uVar2 = 0;
      begin = (wchar_t *)(begin + 1);
    }
    else {
      peVar3 = (error_handler *)(begin + 1);
      uVar2 = 0;
      do {
        if (0xccccccc < uVar2) {
          uVar2 = 0x80000000;
          this_00 = peVar3 + -4;
          break;
        }
        uVar2 = (*(wchar_t *)(peVar3 + -4) + uVar2 * 10) - 0x30;
        this_00 = peVar3;
        if (peVar3 == (error_handler *)end) break;
        begin = (wchar_t *)((long)begin + 4);
        wVar1 = *(wchar_t *)peVar3;
        peVar3 = peVar3 + 4;
        this_00 = (error_handler *)begin;
      } while ((uint)(wVar1 + L'\xffffffd0') < 10);
      begin = (wchar_t *)this_00;
      if ((int)uVar2 < 0) {
        error_handler::on_error(this_00,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ).super_specs_setter<wchar_t>.specs_)->super_align_spec).width_ = uVar2;
  }
  else if (wVar1 == L'{') {
    peVar3 = (error_handler *)(begin + 1);
    local_18.handler = in_RAX;
    if (peVar3 != (error_handler *)end) {
      local_18.handler = handler;
      peVar3 = (error_handler *)
               parse_arg_id<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                         ((wchar_t *)peVar3,end,&local_18);
    }
    if ((peVar3 == (error_handler *)end) || (*(int *)peVar3 != 0x7d)) {
      error_handler::on_error(peVar3,"invalid format string");
    }
    begin = (wchar_t *)(peVar3 + 4);
  }
  return (wchar_t *)(error_handler *)begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_width(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}